

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

path * module_build_path(path *__return_storage_ptr__,string *module)

{
  path local_c0;
  path local_90;
  path local_70;
  path local_50;
  char local_2a [2];
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  string *local_18;
  string *module_local;
  
  local_18 = module;
  module_local = &__return_storage_ptr__->m_pathname;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  local_28 = (char *)std::__cxx11::string::end();
  local_2a[1] = 0x7e;
  local_2a[0] = '/';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_20,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_28,local_2a + 1,local_2a);
  boost::filesystem::path::path(&local_70,"libs");
  boost::filesystem::path::path(&local_90,module);
  boost::filesystem::operator/(&local_50,&local_70,&local_90);
  boost::filesystem::path::path(&local_c0,"build");
  boost::filesystem::operator/(__return_storage_ptr__,&local_50,&local_c0);
  boost::filesystem::path::~path(&local_c0);
  boost::filesystem::path::~path(&local_50);
  boost::filesystem::path::~path(&local_90);
  boost::filesystem::path::~path(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static fs::path module_build_path( std::string module )
{
    std::replace( module.begin(), module.end(), '~', '/' );
    return fs::path( "libs" ) / module / "build";
}